

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Classifer __thiscall CLI::App::_recognize(App *this,string *current)

{
  bool bVar1;
  Classifer CVar2;
  string dummy2;
  string dummy1;
  
  dummy1._M_dataplus._M_p = (pointer)&dummy1.field_2;
  dummy1._M_string_length = 0;
  dummy1.field_2._M_local_buf[0] = '\0';
  dummy2._M_dataplus._M_p = (pointer)&dummy2.field_2;
  dummy2._M_string_length = 0;
  dummy2.field_2._M_local_buf[0] = '\0';
  bVar1 = ::std::operator==(current,"--");
  if (bVar1) {
    CVar2 = POSITIONAL_MARK;
  }
  else {
    bVar1 = _valid_subcommand(this,current);
    if (bVar1) {
      CVar2 = SUBCOMMAND;
    }
    else {
      bVar1 = detail::split_long(current,&dummy1,&dummy2);
      if (bVar1) {
        CVar2 = LONG;
      }
      else {
        bVar1 = detail::split_short(current,&dummy1,&dummy2);
        CVar2 = (uint)bVar1 * 2;
      }
    }
  }
  ::std::__cxx11::string::~string((string *)&dummy2);
  ::std::__cxx11::string::~string((string *)&dummy1);
  return CVar2;
}

Assistant:

detail::Classifer _recognize(const std::string &current) const {
        std::string dummy1, dummy2;

        if(current == "--")
            return detail::Classifer::POSITIONAL_MARK;
        if(_valid_subcommand(current))
            return detail::Classifer::SUBCOMMAND;
        if(detail::split_long(current, dummy1, dummy2))
            return detail::Classifer::LONG;
        if(detail::split_short(current, dummy1, dummy2))
            return detail::Classifer::SHORT;
        return detail::Classifer::NONE;
    }